

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

int nk_menu_begin_symbol(nk_context *ctx,char *id,nk_symbol_type sym,nk_vec2 size)

{
  nk_window *win;
  nk_widget_layout_states nVar1;
  int iVar2;
  nk_context *in;
  nk_rect header;
  nk_rect local_48;
  nk_vec2 local_38;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x442d,
                  "int nk_menu_begin_symbol(struct nk_context *, const char *, enum nk_symbol_type, struct nk_vec2)"
                 );
  }
  win = ctx->current;
  if (win != (nk_window *)0x0) {
    local_38 = size;
    if (win->layout != (nk_panel *)0x0) {
      nVar1 = nk_widget(&local_48,ctx);
      if (nVar1 != NK_WIDGET_INVALID) {
        if (nVar1 == NK_WIDGET_ROM) {
          in = (nk_context *)0x0;
        }
        else {
          in = (nk_context *)0x0;
          if ((win->layout->flags & 0x1000) == 0) {
            in = ctx;
          }
        }
        iVar2 = nk_do_button_symbol(&ctx->last_widget_state,&win->buffer,local_48,sym,
                                    NK_BUTTON_DEFAULT,&(ctx->style).menu_button,&in->input,
                                    (ctx->style).font);
        nVar1 = nk_menu_begin(ctx,win,id,(uint)(iVar2 != 0),local_48,local_38);
      }
      return nVar1;
    }
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x442f,
                  "int nk_menu_begin_symbol(struct nk_context *, const char *, enum nk_symbol_type, struct nk_vec2)"
                 );
  }
  __assert_fail("ctx->current",
                "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h",
                0x442e,
                "int nk_menu_begin_symbol(struct nk_context *, const char *, enum nk_symbol_type, struct nk_vec2)"
               );
}

Assistant:

NK_API int
nk_menu_begin_symbol(struct nk_context *ctx, const char *id,
    enum nk_symbol_type sym, struct nk_vec2 size)
{
    struct nk_window *win;
    const struct nk_input *in;
    struct nk_rect header;
    int is_clicked = nk_false;
    nk_flags state;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout)
        return 0;

    win = ctx->current;
    state = nk_widget(&header, ctx);
    if (!state) return 0;
    in = (state == NK_WIDGET_ROM || win->layout->flags & NK_WINDOW_ROM) ? 0 : &ctx->input;
    if (nk_do_button_symbol(&ctx->last_widget_state,  &win->buffer, header,
        sym, NK_BUTTON_DEFAULT, &ctx->style.menu_button, in, ctx->style.font))
        is_clicked = nk_true;
    return nk_menu_begin(ctx, win, id, is_clicked, header, size);
}